

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall
serialize_tests::CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
          (CSerializeMethodsTestSingle *this,int intvalin,bool boolvalin,string stringvalin,
          uint8_t *charstrvalin,CTransactionRef *txvalin)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->intval = intvalin;
  this->boolval = boolvalin;
  std::__cxx11::string::string
            ((string *)&this->stringval,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)charstrvalin);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->txval).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,in_R9
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    p_Var2 = (txvalin->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    *(element_type **)this->charstrval =
         (txvalin->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this->charstrval + 8) = p_Var2;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSerializeMethodsTestSingle(int intvalin, bool boolvalin, std::string stringvalin, const uint8_t* charstrvalin, const CTransactionRef& txvalin) : intval(intvalin), boolval(boolvalin), stringval(std::move(stringvalin)), txval(txvalin)
    {
        memcpy(charstrval, charstrvalin, sizeof(charstrval));
    }